

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_goto_available_union_field(coda_cursor *cursor)

{
  coda_backend cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  int *piVar5;
  coda_type *pcVar6;
  
  if (((cursor == (coda_cursor *)0x0) || (lVar3 = (long)cursor->n, lVar3 < 1)) ||
     (pcVar6 = (coda_type *)cursor->stack[lVar3 - 1U & 0xffffffff].type, pcVar6 == (coda_type *)0x0)
     ) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x31e);
    return -1;
  }
  if (99 < pcVar6->format) {
    pcVar6 = *(coda_type **)&pcVar6->type_class;
  }
  if (pcVar6->type_class != coda_record_class) {
    pcVar4 = coda_type_get_class_name(pcVar6->type_class);
    coda_set_error(-0x69,"cursor does not refer to a record (current type is %s)",pcVar4);
    return -1;
  }
  cVar1 = (cursor->stack[lVar3 + -1].type)->backend;
  if (cVar1 < 2) {
    iVar2 = coda_ascbin_cursor_goto_available_union_field(cursor);
  }
  else {
    if (cVar1 != coda_backend_memory) {
      if (cVar1 - coda_backend_hdf4 < 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                      ,0x33e,"int coda_cursor_goto_available_union_field(coda_cursor *)");
      }
      goto LAB_0012e058;
    }
    iVar2 = coda_mem_cursor_goto_available_union_field(cursor);
  }
  if (iVar2 != 0) {
    return -1;
  }
LAB_0012e058:
  if ((cursor->stack[(long)cursor->n + -1].type)->backend == coda_backend_memory) {
    coda_mem_cursor_update_offset(cursor);
  }
  piVar5 = (int *)__tls_get_addr(&PTR_001e0dc0);
  if (*piVar5 != 0) {
    pcVar6 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar6->format) {
      pcVar6 = *(coda_type **)&pcVar6->type_class;
    }
    if ((pcVar6->type_class == 6) &&
       (iVar2 = coda_cursor_use_base_type_of_special_type(cursor), iVar2 != 0)) {
      return -1;
    }
  }
  return 0;
}

Assistant:

LIBCODA_API int coda_cursor_goto_available_union_field(coda_cursor *cursor)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_record_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a record (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            if (coda_ascbin_cursor_goto_available_union_field(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_memory:
            if (coda_mem_cursor_goto_available_union_field(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    if (cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        coda_mem_cursor_update_offset(cursor);
    }

    if (coda_option_bypass_special_types &&
        coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class == coda_special_class)
    {
        if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
        {
            return -1;
        }
    }

    return 0;
}